

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O2

errr finish_parse_pit(parser *p)

{
  ushort uVar1;
  pit_profile *ppVar2;
  angband_constants *paVar3;
  undefined8 *puVar4;
  uint16_t uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  undefined8 *puVar9;
  pit_profile *ppVar10;
  ulong uVar11;
  ulong uVar12;
  byte bVar13;
  
  bVar13 = 0;
  z_info->pit_max = 0;
  puVar4 = (undefined8 *)parser_priv(p);
  paVar3 = z_info;
  uVar5 = z_info->pit_max;
  for (; puVar4 != (undefined8 *)0x0; puVar4 = (undefined8 *)*puVar4) {
    uVar5 = uVar5 + 1;
    paVar3->pit_max = uVar5;
  }
  pit_info = (pit_profile *)mem_zalloc((ulong)uVar5 * 0x78 + 0x78);
  uVar1 = z_info->pit_max;
  puVar4 = (undefined8 *)parser_priv(p);
  lVar8 = (ulong)uVar1 * 0x78;
  uVar12 = (ulong)uVar1;
  while( true ) {
    uVar11 = uVar12 - 1;
    if (puVar4 == (undefined8 *)0x0) {
      z_info->pit_max = z_info->pit_max + 1;
      parser_destroy(p);
      return 0;
    }
    if (uVar11 == 0xffffffffffffffff) break;
    uVar6 = uVar11 & 0xffffffff;
    puVar9 = puVar4;
    ppVar10 = pit_info + uVar6;
    for (lVar7 = 0xf; ppVar2 = pit_info, lVar7 != 0; lVar7 = lVar7 + -1) {
      ppVar10->next = (pit_profile *)*puVar9;
      puVar9 = puVar9 + (ulong)bVar13 * -2 + 1;
      ppVar10 = (pit_profile *)((long)ppVar10 + (ulong)bVar13 * -0x10 + 8);
    }
    pit_info[uVar6].pit_idx = (wchar_t)uVar11;
    puVar9 = (undefined8 *)*puVar4;
    ppVar10 = (pit_profile *)(ppVar2->flags + lVar8 + -0x28);
    if (z_info->pit_max <= uVar12) {
      ppVar10 = (pit_profile *)0x0;
    }
    ppVar2[uVar6].next = ppVar10;
    mem_free(puVar4);
    lVar8 = lVar8 + -0x78;
    puVar4 = puVar9;
    uVar12 = uVar11;
  }
  __assert_fail("pit_idx >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-init.c"
                ,0x9be,"errr finish_parse_pit(struct parser *)");
}

Assistant:

static errr finish_parse_pit(struct parser *p) {
	struct pit_profile *pit, *n;
	int pit_idx;
		
	/* Scan the list for the max id */
	z_info->pit_max = 0;
	pit = parser_priv(p);
	while (pit) {
		z_info->pit_max++;
		pit = pit->next;
	}

	/* Allocate the direct access list and copy the data to it */
	pit_info = mem_zalloc((z_info->pit_max + 1) * sizeof(*pit));
	pit_idx = z_info->pit_max - 1;
	for (pit = parser_priv(p); pit; pit = n, pit_idx--) {
		assert(pit_idx >= 0);

		memcpy(&pit_info[pit_idx], pit, sizeof(*pit));
		pit_info[pit_idx].pit_idx = pit_idx;
		n = pit->next;
		if (pit_idx < z_info->pit_max - 1)
			pit_info[pit_idx].next = &pit_info[pit_idx + 1];
		else
			pit_info[pit_idx].next = NULL;

		mem_free(pit);
	}
	z_info->pit_max += 1;

	parser_destroy(p);
	return 0;
}